

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O0

bool __thiscall
cmFunctionFunctionBlocker::IsFunctionBlocked
          (cmFunctionFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *param_3)

{
  bool bVar1;
  cmFunctionHelperCommand *this_00;
  cmListFileContext *pcVar2;
  cmState *this_01;
  reference name;
  cmFunctionHelperCommand *local_38;
  cmFunctionHelperCommand *f;
  cmExecutionStatus *param_3_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmFunctionFunctionBlocker *this_local;
  
  f = (cmFunctionHelperCommand *)param_3;
  param_3_local = (cmExecutionStatus *)mf;
  mf_local = (cmMakefile *)lff;
  lff_local = (cmListFileFunction *)this;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff,
                          "function");
  if (bVar1) {
    this->Depth = this->Depth + 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            mf_local,"endfunction");
    if (bVar1) {
      if (this->Depth == 0) {
        this_00 = (cmFunctionHelperCommand *)operator_new(0xa8);
        memset(this_00,0,0xa8);
        cmFunctionHelperCommand::cmFunctionHelperCommand(this_00);
        local_38 = this_00;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this_00->Args,&this->Args);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
                  (&local_38->Functions,&this->Functions);
        pcVar2 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
        std::__cxx11::string::operator=((string *)&local_38->FilePath,(string *)&pcVar2->FilePath);
        cmMakefile::RecordPolicies((cmMakefile *)param_3_local,&local_38->Policies);
        this_01 = cmMakefile::GetState((cmMakefile *)param_3_local);
        name = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->Args,0);
        cmState::AddScriptedCommand(this_01,name,&local_38->super_cmCommand);
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffffc0,(cmFunctionBlocker *)param_3_local,
                   (cmListFileFunction *)this);
        std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
                  ((unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                   &stack0xffffffffffffffc0);
        return true;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,(value_type *)mf_local);
  return true;
}

Assistant:

bool cmFunctionFunctionBlocker::IsFunctionBlocked(
  const cmListFileFunction& lff, cmMakefile& mf, cmExecutionStatus&)
{
  // record commands until we hit the ENDFUNCTION
  // at the ENDFUNCTION call we shift gears and start looking for invocations
  if (lff.Name.Lower == "function") {
    this->Depth++;
  } else if (lff.Name.Lower == "endfunction") {
    // if this is the endfunction for this function then execute
    if (!this->Depth) {
      // create a new command and add it to cmake
      cmFunctionHelperCommand* f = new cmFunctionHelperCommand();
      f->Args = this->Args;
      f->Functions = this->Functions;
      f->FilePath = this->GetStartingContext().FilePath;
      mf.RecordPolicies(f->Policies);
      mf.GetState()->AddScriptedCommand(this->Args[0], f);
      // remove the function blocker now that the function is defined
      mf.RemoveFunctionBlocker(this, lff);
      return true;
    }
    // decrement for each nested function that ends
    this->Depth--;
  }

  // if it wasn't an endfunction and we are not executing then we must be
  // recording
  this->Functions.push_back(lff);
  return true;
}